

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuerySegment.hpp
# Opt level: O0

void __thiscall
cppjieba::QuerySegment::Cut
          (QuerySegment *this,string *sentence,
          vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words,bool hmm)

{
  bool bVar1;
  ulong uVar2;
  size_type __n;
  Range RVar3;
  undefined1 local_1c0 [8];
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> wrs;
  Range range;
  undefined1 local_190 [8];
  PreFilter pre_filter;
  bool hmm_local;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words_local;
  string *sentence_local;
  QuerySegment *this_local;
  
  pre_filter.symbols_._7_1_ = hmm;
  PreFilter::PreFilter((PreFilter *)local_190,&(this->super_SegmentBase).symbols_,sentence);
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::vector
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_1c0);
  uVar2 = std::__cxx11::string::size();
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_1c0,
             uVar2 >> 1);
  while( true ) {
    bVar1 = PreFilter::HasNext((PreFilter *)local_190);
    if (!bVar1) break;
    RVar3 = PreFilter::Next((PreFilter *)local_190);
    wrs.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)RVar3.begin;
    Cut(this,(const_iterator)
             wrs.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,RVar3.end,
        (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_1c0,
        (bool)(pre_filter.symbols_._7_1_ & 1));
  }
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::clear(words);
  __n = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::size
                  ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_1c0);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::reserve(words,__n);
  GetWordsFromWordRanges
            (sentence,(vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_1c0
             ,words);
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~vector
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_1c0);
  PreFilter::~PreFilter((PreFilter *)local_190);
  return;
}

Assistant:

void Cut(const string& sentence, vector<Word>& words, bool hmm = true) const {
    PreFilter pre_filter(symbols_, sentence);
    PreFilter::Range range;
    vector<WordRange> wrs;
    wrs.reserve(sentence.size()/2);
    while (pre_filter.HasNext()) {
      range = pre_filter.Next();
      Cut(range.begin, range.end, wrs, hmm);
    }
    words.clear();
    words.reserve(wrs.size());
    GetWordsFromWordRanges(sentence, wrs, words);
  }